

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trsm.hpp
# Opt level: O3

void remora::bindings::
     trsm_recursive<remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double,remora::column_major,remora::dense_tag,remora::cpu_tag>,remora::triangular_tag<false,false>>
               (long *Afull,long *Bfull,long start,long end)

{
  long lVar1;
  long lVar2;
  size_t stride1;
  long lVar3;
  ulong uVar4;
  type B;
  type A;
  type Bback;
  type Bfront;
  long local_d0;
  ulong local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  ulong local_a8;
  ulong local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  ulong local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  ulong local_40;
  long local_38;
  
  local_c0 = Bfull[2];
  lVar2 = Afull[3];
  lVar1 = lVar2 * start * 8 + *Afull + start * 8;
  local_c8 = end - start;
  local_b8 = Bfull[3];
  local_d0 = start * 8 + *Bfull;
  local_b0 = lVar1;
  local_a8 = local_c8;
  local_a0 = local_c8;
  local_98 = lVar2;
  if (local_c8 < 0x21) {
    trsm_block<32ul,16ul,false,remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double,remora::column_major,remora::dense_tag,remora::cpu_tag>>
              (&local_b0,&local_d0);
  }
  else {
    uVar4 = local_c8 + 0x1f >> 1 & 0xffffffffffffffe0;
    local_90 = local_d0 + uVar4 * 8;
    lVar3 = local_c8 - uVar4;
    local_88 = lVar3;
    local_80 = local_c0;
    local_78 = local_b8;
    local_70 = local_d0;
    local_68 = uVar4;
    local_60 = local_c0;
    local_58 = local_b8;
    trsm_recursive<remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double,remora::column_major,remora::dense_tag,remora::cpu_tag>,remora::triangular_tag<false,false>>
              (Afull,Bfull);
    local_50 = lVar2 * uVar4 * 8 + lVar1;
    local_48 = lVar3;
    local_40 = uVar4;
    local_38 = lVar2;
    gemm<remora::dense_matrix_adaptor<double,remora::column_major,remora::dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double,remora::column_major,remora::dense_tag,remora::cpu_tag>,remora::row_major,remora::column_major,remora::dense_tag,remora::dense_tag>
              (0xbff0000000000000,&local_50,&local_70,&local_90);
    trsm_recursive<remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double,remora::column_major,remora::dense_tag,remora::cpu_tag>,remora::triangular_tag<false,false>>
              (Afull,Bfull,uVar4 + start,end);
  }
  return;
}

Assistant:

void trsm_recursive(
	matrix_expression<MatA, cpu_tag> const& Afull,
	matrix_expression<MatB, cpu_tag> & Bfull,
	std::size_t start,
	std::size_t end,
	Triangular t,
	left l
){
	static std::size_t const Block_Size =  32;
	std::size_t num_rhs = Bfull().size2();
	auto A = subrange(Afull,start,end,start,end);
	auto B = subrange(Bfull,start,end,0,num_rhs);
	//if the matrix is small enough call the computation kernel directly for the block
	if(A.size1() <= Block_Size){
		trsm_block<Block_Size,16,Triangular::is_unit>(A,B,triangular_tag<Triangular::is_upper,false>(), typename MatB::orientation());
		return;
	}
	std::size_t size = A.size1();
	std::size_t numBlocks =(A.size1()+Block_Size-1)/Block_Size;
	std::size_t split = numBlocks/2*Block_Size;
	auto Bfront = subrange(B,0,split,0,num_rhs);
	auto Bback = subrange(B,split,size,0,num_rhs);

	//otherwise run the kernel recursively
	if(Triangular::is_upper){ //Upper triangular case
		trsm_recursive(Afull, Bfull,start+split,end, t, l);
		kernels::gemm(subrange(A,0,split,split,size), Bback, Bfront, -1.0);
		trsm_recursive(Afull, Bfull,start,start+split, t, l);
	}else{// Lower triangular caste
		trsm_recursive(Afull, Bfull,start,start+split, t, l);
		kernels::gemm(subrange(A,split,size,0,split), Bfront, Bback, -1.0);
		trsm_recursive(Afull, Bfull,start+split,end, t, l);
	}
}